

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

mkroom * search_special(level *lev,schar type)

{
  mkroom *pmVar1;
  char cVar2;
  
  pmVar1 = lev->rooms;
  while( true ) {
    if (pmVar1->hx < '\0') {
      pmVar1 = lev->subrooms;
      while( true ) {
        if (pmVar1->hx < '\0') {
          return (mkroom *)0x0;
        }
        cVar2 = pmVar1->rtype;
        if (type == -2) {
          if ('\x11' < cVar2) {
            return pmVar1;
          }
        }
        else if (type == -1) {
          if (cVar2 != '\0') {
            return pmVar1;
          }
          cVar2 = '\0';
        }
        if (cVar2 == type) break;
        pmVar1 = pmVar1 + 1;
      }
      return pmVar1;
    }
    cVar2 = pmVar1->rtype;
    if (type == -2) {
      if ('\x11' < cVar2) {
        return pmVar1;
      }
    }
    else if (type == -1) {
      if (cVar2 != '\0') {
        return pmVar1;
      }
      cVar2 = '\0';
    }
    if (cVar2 == type) break;
    pmVar1 = pmVar1 + 1;
  }
  return pmVar1;
}

Assistant:

struct mkroom *search_special(struct level *lev, schar type)
{
	struct mkroom *croom;

	for (croom = &lev->rooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	for (croom = &lev->subrooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	return NULL;
}